

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int ParseEXRHeaderFromFile(EXRHeader *exr_header,EXRVersion *exr_version,char *filename,char **err)

{
  reference __ptr;
  char *in_RDX;
  long in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  size_t ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  size_t filesize;
  FILE *fp;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  string *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  allocator_type *in_stack_fffffffffffffe80;
  size_type in_stack_fffffffffffffe88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe90;
  allocator *paVar1;
  allocator local_121;
  string local_120 [32];
  string local_100 [32];
  size_t local_e0;
  allocator<unsigned_char> local_d1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  size_t local_b8;
  allocator local_a9;
  string local_a8 [32];
  string local_88 [32];
  FILE *local_68;
  char **in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  uchar *in_stack_ffffffffffffffb8;
  EXRVersion *in_stack_ffffffffffffffc0;
  EXRHeader *in_stack_ffffffffffffffc8;
  int local_4;
  
  if (((in_RDI == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) || (in_RSI == 0)) ||
     (in_RDX == (char *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffb8,"Invalid argument for ParseEXRHeaderFromFile",
               (allocator *)&stack0xffffffffffffffb7);
    tinyexr::SetErrorMessage
              (in_stack_fffffffffffffe70,
               (char **)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
    local_4 = -3;
  }
  else {
    local_68 = (FILE *)0x0;
    local_68 = fopen(in_RDX,"rb");
    if (local_68 == (FILE *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,in_RDX,&local_a9);
      std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      tinyexr::SetErrorMessage
                (in_stack_fffffffffffffe70,
                 (char **)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      local_4 = -7;
    }
    else {
      fseek(local_68,0,2);
      local_b8 = ftell(local_68);
      fseek(local_68,0,0);
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1de373);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      std::allocator<unsigned_char>::~allocator(&local_d1);
      __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_d0,0);
      local_e0 = fread(__ptr,1,local_b8,local_68);
      fclose(local_68);
      if (local_e0 == local_b8) {
        in_stack_fffffffffffffe80 =
             (allocator_type *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (in_RDI,CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        local_4 = ParseEXRHeaderFromMemory
                            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                             in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                             in_stack_ffffffffffffffa8);
      }
      else {
        paVar1 = &local_121;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_120,in_RDX,paVar1);
        std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
        tinyexr::SetErrorMessage
                  (in_stack_fffffffffffffe70,
                   (char **)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        std::__cxx11::string::~string(local_100);
        std::__cxx11::string::~string(local_120);
        std::allocator<char>::~allocator((allocator<char> *)&local_121);
        local_4 = -5;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe80)
      ;
    }
  }
  return local_4;
}

Assistant:

int ParseEXRHeaderFromFile(EXRHeader *exr_header, const EXRVersion *exr_version,
                           const char *filename, const char **err) {
  if (exr_header == NULL || exr_version == NULL || filename == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for ParseEXRHeaderFromFile",
                             err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  FILE *fp = NULL;
#ifdef _WIN32
#if defined(_MSC_VER) || defined(__MINGW32__)  // MSVC, MinGW gcc or clang
  errno_t errcode =
      _wfopen_s(&fp, tinyexr::UTF8ToWchar(filename).c_str(), L"rb");
  if (errcode != 0) {
    tinyexr::SetErrorMessage("Cannot read file " + std::string(filename), err);
    return TINYEXR_ERROR_INVALID_FILE;
  }
#else
  // Unknown compiler
  fp = fopen(filename, "rb");
#endif
#else
  fp = fopen(filename, "rb");
#endif
  if (!fp) {
    tinyexr::SetErrorMessage("Cannot read file " + std::string(filename), err);
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = static_cast<size_t>(ftell(fp));
  fseek(fp, 0, SEEK_SET);

  std::vector<unsigned char> buf(filesize);  // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    assert(ret == filesize);
    fclose(fp);

    if (ret != filesize) {
      tinyexr::SetErrorMessage("fread() error on " + std::string(filename),
                               err);
      return TINYEXR_ERROR_INVALID_FILE;
    }
  }

  return ParseEXRHeaderFromMemory(exr_header, exr_version, &buf.at(0), filesize,
                                  err);
}